

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8to1.h
# Opt level: O1

void ncnn::conv3x3s1_pack8to1_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  void *pvVar20;
  void *pvVar21;
  void *pvVar22;
  size_t sVar23;
  size_t sVar24;
  size_t sVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  void *pvVar40;
  int iVar41;
  undefined1 (*pauVar42) [32];
  long lVar43;
  void *pvVar44;
  long lVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  float fVar52;
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float in_register_0000159c;
  float in_register_000015dc;
  
  iVar13 = top_blob->c;
  if (0 < (long)iVar13) {
    uVar14 = bottom_blob->c;
    iVar15 = top_blob->w;
    uVar16 = top_blob->h;
    pvVar20 = _bias->data;
    iVar17 = top_blob->dims;
    iVar18 = top_blob->h;
    lVar38 = top_blob->cstep * top_blob->elemsize;
    pvVar21 = top_blob->data;
    iVar19 = top_blob->w;
    pvVar22 = kernel->data;
    sVar23 = kernel->cstep;
    sVar24 = kernel->elemsize;
    sVar25 = bottom_blob->elemsize;
    lVar35 = bottom_blob->cstep * sVar25;
    lVar28 = (long)bottom_blob->data + 0x40;
    lVar32 = 0;
    auVar49 = ZEXT3264(_DAT_00317180);
    auVar51 = ZEXT3264(_DAT_003171a0);
    auVar54 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    pvVar40 = pvVar21;
    do {
      auVar55 = ZEXT1664(auVar54);
      auVar53._28_4_ = 0.0;
      iVar41 = 1;
      if (iVar17 != 3) {
        iVar41 = top_blob->d;
      }
      if (pvVar20 == (void *)0x0) {
        auVar57 = ZEXT816(0) << 0x40;
      }
      else {
        auVar57 = ZEXT416(*(uint *)((long)pvVar20 + lVar32 * 4));
      }
      uVar27 = iVar41 * iVar18 * iVar19;
      if (0 < (int)uVar27) {
        auVar59._8_8_ = 0;
        auVar59._0_8_ = (ulong)uVar27 - 1;
        auVar59 = vpshufd_avx(auVar59,0x44);
        auVar57 = vshufps_avx(auVar57,auVar57,0);
        auVar58._16_16_ = auVar57;
        auVar58._0_16_ = auVar57;
        uVar30 = auVar59._0_8_;
        auVar57._0_8_ = uVar30 ^ 0x8000000000000000;
        auVar57._8_4_ = auVar59._8_4_;
        uVar26 = auVar59._12_4_;
        auVar57._12_4_ = uVar26 ^ 0x80000000;
        auVar60._0_8_ = uVar30 ^ 0x8000000000000000;
        auVar60._8_4_ = auVar57._8_4_;
        auVar60._12_4_ = uVar26 ^ 0x80000000;
        auVar61._0_8_ = uVar30 ^ 0x8000000000000000;
        auVar61._8_4_ = auVar57._8_4_;
        auVar61._12_4_ = uVar26 ^ 0x80000000;
        uVar30 = 0;
        do {
          auVar62._8_8_ = 0;
          auVar62._0_8_ = uVar30;
          auVar59 = vpshufd_avx(auVar62,0x44);
          auVar64._16_16_ = auVar59;
          auVar64._0_16_ = auVar59;
          auVar65 = vorps_avx(auVar64,auVar49._0_32_);
          auVar64 = vorps_avx(auVar64,auVar51._0_32_);
          auVar67._0_8_ = auVar64._16_8_ ^ 0x8000000000000000;
          auVar67._8_4_ = auVar64._24_4_;
          auVar67._12_4_ = auVar64._28_4_ ^ 0x80000000;
          auVar59 = vpcmpgtq_avx(auVar67,auVar57);
          auVar63._0_8_ = auVar64._0_8_ ^ 0x8000000000000000;
          auVar63._8_4_ = auVar64._8_4_;
          auVar63._12_4_ = auVar64._12_4_ ^ 0x80000000;
          auVar62 = vpcmpgtq_avx(auVar63,auVar60);
          auVar59 = vpackssdw_avx(auVar62,auVar59);
          auVar68._0_8_ = auVar65._16_8_ ^ 0x8000000000000000;
          auVar68._8_4_ = auVar65._24_4_;
          auVar68._12_4_ = auVar65._28_4_ ^ 0x80000000;
          auVar62 = vpcmpgtq_avx(auVar68,auVar57);
          auVar66._0_8_ = auVar65._0_8_ ^ 0x8000000000000000;
          auVar66._8_4_ = auVar65._8_4_;
          auVar66._12_4_ = auVar65._12_4_ ^ 0x80000000;
          auVar63 = vpcmpgtq_avx(auVar66,auVar61);
          auVar62 = vpackssdw_avx(auVar63,auVar62);
          auVar59 = vpackssdw_avx(auVar62 ^ auVar54,auVar59 ^ auVar54);
          auVar62 = vpmovsxwd_avx(auVar59);
          auVar59 = vpunpckhwd_avx(auVar59,auVar59);
          auVar65._16_16_ = auVar59;
          auVar65._0_16_ = auVar62;
          auVar65 = vmaskmovps_avx(auVar65,auVar58);
          *(undefined1 (*) [32])((long)pvVar40 + uVar30 * 4) = auVar65;
          uVar30 = uVar30 + 8;
        } while ((uVar27 + 7 & 0xfffffff8) != uVar30);
      }
      if (0 < (int)uVar14) {
        pauVar42 = (undefined1 (*) [32])(sVar23 * sVar24 * lVar32 + (long)pvVar22);
        lVar36 = sVar25 * (long)bottom_blob->w;
        lVar33 = lVar28 + lVar36;
        lVar34 = (long)bottom_blob->w * sVar25 * 2 + lVar28;
        uVar30 = 0;
        lVar45 = lVar28;
        do {
          if (0 < (int)uVar16) {
            auVar58 = *pauVar42;
            auVar65 = pauVar42[1];
            auVar64 = pauVar42[2];
            auVar7 = pauVar42[3];
            auVar8 = pauVar42[4];
            auVar9 = pauVar42[5];
            auVar10 = pauVar42[6];
            auVar11 = pauVar42[7];
            auVar12 = pauVar42[8];
            uVar39 = 0;
            lVar29 = lVar33;
            lVar31 = lVar45;
            lVar37 = lVar34;
            pvVar44 = (void *)(lVar38 * lVar32 + (long)pvVar21);
            do {
              if (0 < iVar15) {
                lVar43 = 0;
                auVar56 = auVar55;
                iVar41 = iVar15;
                do {
                  pfVar3 = (float *)(lVar31 + -0x40 + lVar43 * 8);
                  pfVar4 = (float *)(lVar31 + -0x20 + lVar43 * 8);
                  pfVar1 = (float *)(lVar31 + lVar43 * 8);
                  pfVar5 = (float *)(lVar29 + -0x40 + lVar43 * 8);
                  fVar52 = in_register_0000159c + auVar51._28_4_;
                  pfVar6 = (float *)(lVar29 + -0x20 + lVar43 * 8);
                  pfVar2 = (float *)(lVar29 + lVar43 * 8);
                  auVar51._0_4_ = auVar9._0_4_ * *pfVar2;
                  auVar51._4_4_ = auVar9._4_4_ * pfVar2[1];
                  auVar51._8_4_ = auVar9._8_4_ * pfVar2[2];
                  auVar51._12_4_ = auVar9._12_4_ * pfVar2[3];
                  auVar51._16_4_ = auVar9._16_4_ * pfVar2[4];
                  auVar51._20_4_ = auVar9._20_4_ * pfVar2[5];
                  auVar51._28_36_ = auVar56._28_36_;
                  auVar51._24_4_ = auVar9._24_4_ * pfVar2[6];
                  auVar55 = ZEXT3264(auVar51._0_32_);
                  pfVar2 = (float *)(lVar37 + -0x40 + lVar43 * 8);
                  in_register_0000159c = in_register_0000159c + in_register_000015dc;
                  auVar50._0_4_ =
                       auVar58._0_4_ * *pfVar3 + auVar7._0_4_ * *pfVar5 + auVar10._0_4_ * *pfVar2;
                  auVar50._4_4_ =
                       auVar58._4_4_ * pfVar3[1] + auVar7._4_4_ * pfVar5[1] +
                       auVar10._4_4_ * pfVar2[1];
                  auVar50._8_4_ =
                       auVar58._8_4_ * pfVar3[2] + auVar7._8_4_ * pfVar5[2] +
                       auVar10._8_4_ * pfVar2[2];
                  auVar50._12_4_ =
                       auVar58._12_4_ * pfVar3[3] + auVar7._12_4_ * pfVar5[3] +
                       auVar10._12_4_ * pfVar2[3];
                  auVar50._16_4_ =
                       auVar58._16_4_ * pfVar3[4] + auVar7._16_4_ * pfVar5[4] +
                       auVar10._16_4_ * pfVar2[4];
                  auVar50._20_4_ =
                       auVar58._20_4_ * pfVar3[5] + auVar7._20_4_ * pfVar5[5] +
                       auVar10._20_4_ * pfVar2[5];
                  auVar50._24_4_ =
                       auVar58._24_4_ * pfVar3[6] + auVar7._24_4_ * pfVar5[6] +
                       auVar10._24_4_ * pfVar2[6];
                  auVar50._28_4_ = fVar52 + auVar53._28_4_;
                  pfVar2 = (float *)(lVar37 + -0x20 + lVar43 * 8);
                  auVar53._0_4_ =
                       auVar8._0_4_ * *pfVar6 + auVar65._0_4_ * *pfVar4 + auVar11._0_4_ * *pfVar2;
                  auVar53._4_4_ =
                       auVar8._4_4_ * pfVar6[1] + auVar65._4_4_ * pfVar4[1] +
                       auVar11._4_4_ * pfVar2[1];
                  auVar53._8_4_ =
                       auVar8._8_4_ * pfVar6[2] + auVar65._8_4_ * pfVar4[2] +
                       auVar11._8_4_ * pfVar2[2];
                  auVar53._12_4_ =
                       auVar8._12_4_ * pfVar6[3] + auVar65._12_4_ * pfVar4[3] +
                       auVar11._12_4_ * pfVar2[3];
                  auVar53._16_4_ =
                       auVar8._16_4_ * pfVar6[4] + auVar65._16_4_ * pfVar4[4] +
                       auVar11._16_4_ * pfVar2[4];
                  auVar53._20_4_ =
                       auVar8._20_4_ * pfVar6[5] + auVar65._20_4_ * pfVar4[5] +
                       auVar11._20_4_ * pfVar2[5];
                  auVar53._24_4_ =
                       auVar8._24_4_ * pfVar6[6] + auVar65._24_4_ * pfVar4[6] +
                       auVar11._24_4_ * pfVar2[6];
                  auVar53._28_4_ = in_register_0000159c + auVar53._28_4_;
                  auVar50 = vhaddps_avx(auVar50,auVar53);
                  pfVar2 = (float *)(lVar37 + lVar43 * 8);
                  auVar48._0_4_ = auVar51._0_4_ + auVar64._0_4_ * *pfVar1 + auVar12._0_4_ * *pfVar2;
                  auVar48._4_4_ =
                       auVar51._4_4_ + auVar64._4_4_ * pfVar1[1] + auVar12._4_4_ * pfVar2[1];
                  auVar48._8_4_ =
                       auVar51._8_4_ + auVar64._8_4_ * pfVar1[2] + auVar12._8_4_ * pfVar2[2];
                  auVar48._12_4_ =
                       auVar51._12_4_ + auVar64._12_4_ * pfVar1[3] + auVar12._12_4_ * pfVar2[3];
                  auVar48._16_4_ =
                       auVar51._16_4_ + auVar64._16_4_ * pfVar1[4] + auVar12._16_4_ * pfVar2[4];
                  auVar48._20_4_ =
                       auVar51._20_4_ + auVar64._20_4_ * pfVar1[5] + auVar12._20_4_ * pfVar2[5];
                  auVar48._24_4_ =
                       auVar51._24_4_ + auVar64._24_4_ * pfVar1[6] + auVar12._24_4_ * pfVar2[6];
                  auVar48._28_4_ = auVar56._28_4_ + auVar49._28_4_ + auVar53._28_4_;
                  auVar48 = vhaddps_avx(auVar48,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar50 = vhaddps_avx(auVar50,auVar48);
                  auVar46._0_4_ = auVar50._16_4_ + auVar50._0_4_;
                  auVar46._4_4_ = auVar50._20_4_ + auVar50._4_4_;
                  auVar46._8_4_ = auVar50._24_4_ + auVar50._8_4_;
                  auVar46._12_4_ = auVar50._28_4_ + auVar50._12_4_;
                  auVar54 = vshufpd_avx(auVar46,auVar46,1);
                  auVar47._0_4_ = auVar54._0_4_ + auVar46._0_4_;
                  auVar47._4_4_ = auVar54._4_4_ + auVar46._4_4_;
                  auVar47._8_4_ = auVar54._8_4_ + auVar46._8_4_;
                  auVar47._12_4_ = auVar54._12_4_ + auVar46._12_4_;
                  auVar54 = vmovshdup_avx(auVar47);
                  fVar52 = auVar54._0_4_ + *(float *)((long)pvVar44 + lVar43);
                  auVar51 = ZEXT464((uint)fVar52);
                  fVar52 = fVar52 + auVar47._0_4_;
                  auVar49 = ZEXT464((uint)fVar52);
                  *(float *)((long)pvVar44 + lVar43) = fVar52;
                  lVar43 = lVar43 + 4;
                  iVar41 = iVar41 + -1;
                  auVar56 = auVar55;
                } while (iVar41 != 0);
                pvVar44 = (void *)((long)pvVar44 + lVar43);
              }
              uVar39 = uVar39 + 1;
              lVar31 = lVar31 + lVar36;
              lVar29 = lVar29 + lVar36;
              lVar37 = lVar37 + lVar36;
            } while (uVar39 != uVar16);
          }
          auVar54 = auVar55._0_16_;
          pauVar42 = pauVar42 + 9;
          uVar30 = uVar30 + 1;
          lVar45 = lVar45 + lVar35;
          lVar33 = lVar33 + lVar35;
          lVar34 = lVar34 + lVar35;
        } while (uVar30 != uVar14);
      }
      lVar32 = lVar32 + 1;
      pvVar40 = (void *)((long)pvVar40 + lVar38);
      auVar49 = ZEXT3264(_DAT_00317180);
      auVar51 = ZEXT3264(_DAT_003171a0);
      auVar54 = vpcmpeqd_avx(auVar54,auVar54);
    } while (lVar32 != iVar13);
  }
  return;
}

Assistant:

static void conv3x3s1_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    int remain_outch_start = 0;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;
        out0.fill(bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            __m256 _k00 = _mm256_loadu_ps(k0);
            __m256 _k01 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22 = _mm256_loadu_ps(k0 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                const float* r0 = img0.row(i);
                const float* r1 = img0.row(i + 1);
                const float* r2 = img0.row(i + 2);
                int j = 0;
                for (; j < outw; j++)
                {
                    __m256 _r00 = _mm256_loadu_ps(r0);
                    __m256 _r01 = _mm256_loadu_ps(r0 + 8);
                    __m256 _r02 = _mm256_loadu_ps(r0 + 16);

                    __m256 _sum0 = _mm256_mul_ps(_k00, _r00);
                    __m256 _sum1 = _mm256_mul_ps(_k01, _r01);
                    __m256 _sum2 = _mm256_mul_ps(_k02, _r02);

                    __m256 _r10 = _mm256_loadu_ps(r1);
                    __m256 _r11 = _mm256_loadu_ps(r1 + 8);
                    __m256 _r12 = _mm256_loadu_ps(r1 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k12, _r12, _sum2);

                    __m256 _r20 = _mm256_loadu_ps(r2);
                    __m256 _r21 = _mm256_loadu_ps(r2 + 8);
                    __m256 _r22 = _mm256_loadu_ps(r2 + 16);

                    _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_k21, _r21, _sum1);
                    _sum2 = _mm256_comp_fmadd_ps(_k22, _r22, _sum2);
                    __m128 _sum = HorizontalSums(_sum0, _sum1, _sum2);

                    *outptr0 += _mm_reduce_add_ps(_sum); // dot
                    outptr0++;
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                }
            }

            k0 += 9 * 8;
        }
    }
}